

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iuutil::
CmpHelperNeIterator<int_const*,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (AssertionResult *__return_storage_ptr__,iuutil *this,int *b1,int *e1,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> b2,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> e2)

{
  bool bVar1;
  reference piVar2;
  AssertionResult *rhs;
  int *piVar3;
  bool local_281;
  AssertionResult local_268;
  string local_240;
  AssertionResult local_210;
  AssertionResult local_1e8;
  undefined1 local_1c0 [8];
  Message ar;
  bool result;
  int elem;
  int *e1_local;
  int *b1_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> e2_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> b2_local;
  
  ar.m_stream.super_iu_stringstream._388_4_ = 0;
  ar.m_stream.super_iu_stringstream._387_1_ = 0;
  b1_local = b2._M_current;
  e2_local._M_current = e1;
  iutest::detail::iuStreamMessage::iuStreamMessage((iuStreamMessage *)local_1c0);
  ar.m_stream.super_iu_stringstream._388_4_ = 0;
  e1_local = (int *)this;
  while( true ) {
    local_281 = false;
    if (e1_local != b1) {
      local_281 = __gnu_cxx::operator!=
                            (&e2_local,
                             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)&b1_local);
    }
    if (local_281 == false) break;
    piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*(&e2_local);
    piVar3 = e1_local;
    iutest::internal::backward::NeHelper<false>::Compare<int>(&local_210,"","",e1_local,piVar2);
    iutest::AssertionResult::operator!(&local_1e8,&local_210);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool(&local_1e8);
    iutest::AssertionResult::~AssertionResult(&local_1e8);
    iutest::AssertionResult::~AssertionResult(&local_210);
    if (bVar1) {
      piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&e2_local);
      iutest::internal::FormatForComparisonFailureMessage<int,int>
                (&local_240,(internal *)e1_local,piVar2,piVar3);
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1c0,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
    }
    else {
      ar.m_stream.super_iu_stringstream._387_1_ = 1;
    }
    e1_local = e1_local + 1;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&e2_local);
    ar.m_stream.super_iu_stringstream._388_4_ = ar.m_stream.super_iu_stringstream._388_4_ + 1;
  }
  if ((e1_local != b1) ||
     (bVar1 = __gnu_cxx::operator!=
                        (&e2_local,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &b1_local), bVar1)) {
    ar.m_stream.super_iu_stringstream._387_1_ = 1;
  }
  if ((ar.m_stream.super_iu_stringstream._387_1_ & 1) == 0) {
    iutest::AssertionFailure();
    rhs = iutest::AssertionResult::operator<<(&local_268,(iuStreamMessage *)local_1c0);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    iutest::AssertionResult::~AssertionResult(&local_268);
  }
  else {
    iutest::AssertionSuccess();
  }
  iutest::detail::iuStreamMessage::~iuStreamMessage((iuStreamMessage *)local_1c0);
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNeIterator(T1 b1, T1 e1, T2 b2, T2 e2)
{
    int elem=0;
    bool result = false;
    ::iutest::Message ar;
    for(elem=0; b1 != e1 && b2 != e2; ++b1, ++b2, ++elem)
    {
        if(!::iutest::internal::backward::NeHelper<false>::Compare("", "", *b1, *b2))
        {
            ar << ::iutest::internal::FormatForComparisonFailureMessage(*b1, *b2);
        }
        else
        {
            result = true;
        }
    }
    if( (b1 != e1) || (b2 != e2) )
    {
        result = true;
    }
    if( !result )
    {
        return ::iutest::AssertionFailure() << ar;
    }
    return ::iutest::AssertionSuccess();
}